

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall
icu_63::TextTrieMap::search
          (TextTrieMap *this,CharacterNode *node,UnicodeString *text,int32_t start,int32_t index,
          TextTrieMapSearchResultHandler *handler,UErrorCode *status)

{
  short sVar1;
  char16_t cVar2;
  char16_t cVar3;
  int iVar4;
  uint uVar5;
  char16_t *pcVar6;
  ushort uVar7;
  int32_t index_00;
  ulong uVar8;
  uint16_t uVar9;
  UnicodeString tmp;
  UnicodeString local_70;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     ((node->fValues == (void *)0x0 ||
      ((iVar4 = (**handler->_vptr_TextTrieMapSearchResultHandler)
                          (handler,(ulong)(uint)(index - start),node), (char)iVar4 != '\0' &&
       (*status < U_ILLEGAL_ARGUMENT_ERROR)))))) {
    if (this->fIgnoreCase == '\0') {
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar5 = (text->fUnion).fFields.fLength;
      }
      else {
        uVar5 = (int)sVar1 >> 5;
      }
      cVar3 = L'\xffff';
      if ((uint)index < uVar5) {
        if (((int)sVar1 & 2U) == 0) {
          pcVar6 = (text->fUnion).fFields.fArray;
        }
        else {
          pcVar6 = (char16_t *)((long)&text->fUnion + 2);
        }
        cVar3 = pcVar6[index];
      }
      uVar7 = node->fFirstChild;
      if (uVar7 != 0) {
        index_00 = index + 1;
        do {
          node = this->fNodes + uVar7;
          cVar2 = this->fNodes[uVar7].fCharacter;
          if (cVar2 == cVar3) goto LAB_00203486;
        } while (((ushort)cVar2 <= (ushort)cVar3) && (uVar7 = node->fNextSibling, uVar7 != 0));
      }
    }
    else {
      uVar5 = UnicodeString::char32At(text,index);
      UnicodeString::UnicodeString(&local_70,uVar5);
      UnicodeString::foldCase(&local_70,0);
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (0 < local_70.fUnion.fFields.fLength) {
        if (((int)local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
        }
        uVar8 = 0;
        do {
          uVar9 = node->fFirstChild;
          if (uVar9 == 0) {
LAB_002034a6:
            UnicodeString::~UnicodeString(&local_70);
            return;
          }
          cVar3 = *(char16_t *)((long)local_70.fUnion.fFields.fArray + uVar8 * 2);
          uVar8 = uVar8 + 1;
          while( true ) {
            node = this->fNodes + uVar9;
            cVar2 = this->fNodes[uVar9].fCharacter;
            if (cVar2 == cVar3) break;
            if (((ushort)cVar3 <= (ushort)cVar2 && cVar2 != cVar3) ||
               (uVar9 = node->fNextSibling, uVar9 == 0)) goto LAB_002034a6;
          }
        } while (uVar8 != (uint)local_70.fUnion.fFields.fLength);
      }
      index_00 = (index - (uint)(uVar5 < 0x10000)) + 2;
      UnicodeString::~UnicodeString(&local_70);
LAB_00203486:
      search(this,node,text,start,index_00,handler,status);
    }
  }
  return;
}

Assistant:

void
TextTrieMap::search(CharacterNode *node, const UnicodeString &text, int32_t start,
                  int32_t index, TextTrieMapSearchResultHandler *handler, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return;
    }
    if (node->hasValues()) {
        if (!handler->handleMatch(index - start, node, status)) {
            return;
        }
        if (U_FAILURE(status)) {
            return;
        }
    }
    if (fIgnoreCase) {
        // for folding we need to get a complete code point.
        // size of character may grow after fold operation;
        // then we need to get result as UTF16 code units.
        UChar32 c32 = text.char32At(index);
        index += U16_LENGTH(c32);
        UnicodeString tmp(c32);
        tmp.foldCase();
        int32_t tmpidx = 0;
        while (tmpidx < tmp.length()) {
            UChar c = tmp.charAt(tmpidx++);
            node = getChildNode(node, c);
            if (node == NULL) {
                break;
            }
        }
    } else {
        // here we just get the next UTF16 code unit
        UChar c = text.charAt(index++);
        node = getChildNode(node, c);
    }
    if (node != NULL) {
        search(node, text, start, index, handler, status);
    }
}